

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bignum.cpp
# Opt level: O0

int mbedtls_mpi_read_binary_le(mbedtls_mpi *X,uchar *buf,size_t buflen)

{
  ulong in_RDX;
  size_t in_RSI;
  uchar *in_RDI;
  size_t limbs;
  mbedtls_mpi_uint *in_stack_00000008;
  int ret;
  int local_1c;
  
  local_1c = mbedtls_mpi_resize_clear
                       ((mbedtls_mpi *)((in_RDX >> 3) + (ulong)((in_RDX & 7) != 0)),0x88f50f);
  if (local_1c == 0) {
    local_1c = mbedtls_mpi_core_read_le(in_stack_00000008,limbs,in_RDI,in_RSI);
  }
  return local_1c;
}

Assistant:

int mbedtls_mpi_read_binary_le(mbedtls_mpi *X,
                               const unsigned char *buf, size_t buflen)
{
    int ret = MBEDTLS_ERR_ERROR_CORRUPTION_DETECTED;
    const size_t limbs = CHARS_TO_LIMBS(buflen);

    /* Ensure that target MPI has exactly the necessary number of limbs */
    MBEDTLS_MPI_CHK(mbedtls_mpi_resize_clear(X, limbs));

    MBEDTLS_MPI_CHK(mbedtls_mpi_core_read_le(X->p, X->n, buf, buflen));

cleanup:

    /*
     * This function is also used to import keys. However, wiping the buffers
     * upon failure is not necessary because failure only can happen before any
     * input is copied.
     */
    return ret;
}